

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

void __thiscall
cs::translator_type::match_grammar
          (translator_type *this,context_t *context,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *raw)

{
  iterator *this_00;
  long lVar1;
  long *plVar2;
  token_base *ptVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  size_type sVar8;
  reference pptVar9;
  action_types *paVar10;
  token_base **it;
  long *plVar11;
  ulong uVar12;
  _List_node_base *p_Var13;
  list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
  *__range1;
  long *local_68;
  long *local_58;
  long local_40;
  
  this_00 = &(raw->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
             super__Deque_impl_data._M_start;
  p_Var13 = (_List_node_base *)this;
LAB_00129769:
  do {
    p_Var13 = (((list<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
                 *)&p_Var13->_M_next)->
              super__List_base<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>,_std::allocator<std::shared_ptr<std::pair<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_cs::method_base_*>_>_>_>
              )._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var13 == (_List_node_base *)this) {
      return;
    }
    lVar1 = *(long *)(p_Var13 + 1);
    plVar11 = *(long **)(lVar1 + 0x10);
    local_58 = *(long **)(lVar1 + 0x20);
    local_40 = *(long *)(lVar1 + 0x28);
    plVar2 = *(long **)(lVar1 + 0x30);
    uVar12 = 0;
    bVar4 = false;
    bVar6 = false;
    while (plVar11 != plVar2) {
      iVar7 = (**(code **)(*(long *)*plVar11 + 0x10))();
      if (iVar7 == 0xc) {
        bVar4 = true;
      }
      else if (iVar7 == 2) {
        if (bVar4) {
          for (; sVar8 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size(raw),
              uVar12 < sVar8; uVar12 = uVar12 + 1) {
            pptVar9 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
                      operator[](this_00,uVar12);
            iVar7 = (*(*pptVar9)->_vptr_token_base[2])();
            pptVar9 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
                      operator[](this_00,uVar12);
            ptVar3 = *pptVar9;
            if (iVar7 == 4) {
              bVar5 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                      ::exist((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                               *)compiler_type::action_map_abi_cxx11_,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (ptVar3 + 3));
              if ((bVar5) &&
                 (paVar10 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                            ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                                     *)compiler_type::action_map_abi_cxx11_,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(ptVar3 + 3)), *paVar10 == *(action_types *)(*plVar11 + 0x10)
                 )) break;
            }
            else {
              iVar7 = (*ptVar3->_vptr_token_base[2])(ptVar3);
              if (iVar7 == 2) break;
            }
          }
        }
        sVar8 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size(raw);
        if (uVar12 < sVar8) {
          pptVar9 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
                    operator[](this_00,uVar12);
          iVar7 = (*(*pptVar9)->_vptr_token_base[2])();
          pptVar9 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
                    operator[](this_00,uVar12);
          ptVar3 = *pptVar9;
          if (iVar7 == 4) {
            bVar6 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                    ::exist((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                             *)compiler_type::action_map_abi_cxx11_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (ptVar3 + 3));
            if (bVar6) {
              paVar10 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                        ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                                 *)compiler_type::action_map_abi_cxx11_,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(ptVar3 + 3));
              bVar6 = *paVar10 == *(action_types *)(*plVar11 + 0x10);
              if (!bVar6) goto LAB_00129974;
LAB_00129915:
              uVar12 = uVar12 + 1;
              bVar4 = false;
              goto LAB_0012991c;
            }
            bVar6 = false;
          }
          else {
            iVar7 = (*ptVar3->_vptr_token_base[2])(ptVar3);
            if (iVar7 == 2) {
              pptVar9 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>
                        ::operator[](this_00,uVar12);
              if (*(int *)&(*pptVar9)[1]._vptr_token_base == *(int *)(*plVar11 + 0x10))
              goto LAB_00129915;
LAB_00129974:
              uVar12 = uVar12 + 1;
              goto LAB_0012998c;
            }
          }
          uVar12 = uVar12 + 1;
          goto LAB_0012998c;
        }
        break;
      }
LAB_0012991c:
      plVar11 = plVar11 + 1;
      if (plVar11 == local_58) {
        plVar11 = *(long **)(local_40 + 8);
        local_40 = local_40 + 8;
        local_58 = plVar11 + 0x40;
      }
    }
    if (bVar4) goto code_r0x0012995a;
LAB_0012998c:
    sVar8 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size(raw);
  } while ((uVar12 < sVar8) || (!bVar6));
  goto LAB_001299a8;
code_r0x0012995a:
  sVar8 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size(raw);
  if ((bool)(bVar6 & uVar12 != sVar8)) {
LAB_001299a8:
    lVar1 = *(long *)(p_Var13 + 1);
    plVar11 = *(long **)(lVar1 + 0x10);
    local_68 = *(long **)(lVar1 + 0x20);
    local_58 = *(long **)(lVar1 + 0x28);
    plVar2 = *(long **)(lVar1 + 0x30);
    bVar6 = false;
    uVar12 = 0;
    while (plVar11 != plVar2) {
      iVar7 = (**(code **)(*(long *)*plVar11 + 0x10))();
      if (iVar7 == 0xc) {
        bVar6 = true;
      }
      else if (iVar7 == 2) {
        if (bVar6) {
          for (; sVar8 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size(raw),
              uVar12 < sVar8; uVar12 = uVar12 + 1) {
            pptVar9 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
                      operator[](this_00,uVar12);
            iVar7 = (*(*pptVar9)->_vptr_token_base[2])();
            pptVar9 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
                      operator[](this_00,uVar12);
            ptVar3 = *pptVar9;
            if (iVar7 == 4) {
              bVar6 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                      ::exist((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                               *)compiler_type::action_map_abi_cxx11_,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (ptVar3 + 3));
              if ((bVar6) &&
                 (paVar10 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                            ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                                     *)compiler_type::action_map_abi_cxx11_,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(ptVar3 + 3)), *paVar10 == *(action_types *)(*plVar11 + 0x10)
                 )) break;
            }
            else {
              iVar7 = (*ptVar3->_vptr_token_base[2])(ptVar3);
              if (iVar7 == 2) break;
            }
          }
        }
        pptVar9 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
                  operator[](this_00,uVar12);
        iVar7 = (*(*pptVar9)->_vptr_token_base[2])();
        if (iVar7 == 4) {
          pptVar9 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::
                    operator[](this_00,uVar12);
          ptVar3 = *pptVar9;
          bVar6 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                  ::exist((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                           *)compiler_type::action_map_abi_cxx11_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (ptVar3 + 3));
          if (bVar6) {
            paVar10 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                      ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::action_types>
                               *)compiler_type::action_map_abi_cxx11_,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (ptVar3 + 3));
            ptVar3 = (token_base *)*plVar11;
            if (*paVar10 == *(action_types *)&ptVar3[1]._vptr_token_base) {
              pptVar9 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>
                        ::operator[](this_00,uVar12);
              *pptVar9 = ptVar3;
            }
          }
        }
        uVar12 = uVar12 + 1;
        bVar6 = false;
      }
      plVar11 = plVar11 + 1;
      if (plVar11 == local_68) {
        plVar11 = *(long **)((long)local_58 + 8);
        local_58 = (long *)((long)local_58 + 8);
        local_68 = plVar11 + 0x40;
      }
    }
  }
  goto LAB_00129769;
}

Assistant:

void translator_type::match_grammar(const context_t &context, std::deque<token_base *> &raw)
	{
		for (auto &dat: m_data) {
			bool matched = false;
			{
				bool failed = false, skip_useless = false;
				std::size_t i = 0;
				for (auto &it: dat->first) {
					switch (it->get_type()) {
					default:
						break;
					case token_types::action: {
						if (skip_useless) {
							// Keep looking for id token or action token that have been replaced.
							for (; i < raw.size(); ++i) {
								if (raw[i]->get_type() == token_types::id) {
									auto &id = static_cast<token_id *>(raw[i])->get_id();
									if (context->compiler->action_map.exist(id) &&
									        context->compiler->action_map.match(id) ==
									        static_cast<token_action *>(it)->get_action())
										break;
								}
								else if (raw[i]->get_type() == token_types::action)
									break;
							}
						}
						if (i >= raw.size()) {
							failed = true;
							break;
						}
						// The "matched" condition is satisfied only if the target token is an id and it can match the grammar rule.
						if (raw[i]->get_type() == token_types::id) {
							auto &id = static_cast<token_id *>(raw[i])->get_id();
							if (!context->compiler->action_map.exist(id) ||
							        context->compiler->action_map.match(id) !=
							        static_cast<token_action *>(it)->get_action()) {
								matched = false;
								failed = true;
							}
							else
								matched = true;
						}
						else if (raw[i]->get_type() == token_types::action)
							failed = static_cast<token_action *>(raw[i])->get_action() !=
							         static_cast<token_action *>(it)->get_action();
						else
							failed = true;
						skip_useless = false;
						++i;
						break;
					}
					case token_types::expr:
						skip_useless = true;
						break;
					}
					if (failed)
						break;
				}
				if ((skip_useless && i == raw.size()) || (!skip_useless && i < raw.size()))
					matched = false;
			}
			if (matched) {
				// If matched, find and replace all id token with correspondent action token.
				bool skip_useless = false;
				std::size_t i = 0;
				for (auto &it: dat->first) {
					switch (it->get_type()) {
					default:
						break;
					case token_types::action: {
						if (skip_useless) {
							// Keep looking for id token or action token that have been replaced.
							for (; i < raw.size(); ++i) {
								if (raw[i]->get_type() == token_types::id) {
									auto &id = static_cast<token_id *>(raw[i])->get_id();
									if (context->compiler->action_map.exist(id) &&
									        context->compiler->action_map.match(id) ==
									        static_cast<token_action *>(it)->get_action())
										break;
								}
								else if (raw[i]->get_type() == token_types::action)
									break;
							}
						}
						if (raw[i]->get_type() == token_types::id) {
							auto &id = static_cast<token_id *>(raw[i])->get_id();
							if (context->compiler->action_map.exist(id) &&
							        context->compiler->action_map.match(id) ==
							        static_cast<token_action *>(it)->get_action())
								raw[i] = it;
						}
						skip_useless = false;
						++i;
						break;
					}
					case token_types::expr:
						skip_useless = true;
						break;
					}
				}
			}
		}
	}